

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

AWeapon * __thiscall FWeaponSlot::PickWeapon(FWeaponSlot *this,player_t *player,bool checkammo)

{
  AWeapon *pAVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClassWeapon *pPVar5;
  AWeapon *pAVar6;
  PClass *pPVar7;
  undefined4 extraout_var_01;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  PClassWeapon *pPVar4;
  undefined4 extraout_var_00;
  
  if (player->mo == (APlayerPawn *)0x0) {
    pAVar6 = (AWeapon *)0x0;
  }
  else {
    uVar9 = (this->Weapons).Count;
    pAVar6 = player->ReadyWeapon;
    if (uVar9 != 0) {
      if (pAVar6 != (AWeapon *)0x0) {
        uVar8 = 0;
        do {
          pPVar5 = (this->Weapons).Array[uVar8].Type;
          pAVar6 = player->ReadyWeapon;
          pPVar4 = (PClassWeapon *)
                   (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject.Class;
          if (pPVar4 == (PClassWeapon *)0x0) {
            iVar3 = (**(pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                       super_DObject._vptr_DObject)(pAVar6);
            pPVar4 = (PClassWeapon *)CONCAT44(extraout_var,iVar3);
            (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
            super_DObject.Class = (PClass *)pPVar4;
          }
          if (pPVar5 == pPVar4) {
LAB_004ad213:
            uVar10 = uVar8 & 0xffffffff;
            if (uVar8 != 0) goto LAB_004ad241;
            do {
              uVar10 = (ulong)(this->Weapons).Count;
LAB_004ad241:
              do {
                uVar9 = (int)uVar10 - 1;
                uVar10 = (ulong)uVar9;
                if (uVar8 == uVar10) goto LAB_004ad228;
                pAVar6 = (AWeapon *)
                         AActor::FindInventory
                                   (&player->mo->super_AActor,
                                    (PClassActor *)(this->Weapons).Array[(int)uVar9].Type,false);
                pPVar2 = AWeapon::RegistrationInfo.MyClass;
                if (pAVar6 != (AWeapon *)0x0) {
                  pPVar7 = (pAVar6->super_AStateProvider).super_AInventory.super_AActor.
                           super_DThinker.super_DObject.Class;
                  if (pPVar7 == (PClass *)0x0) {
                    iVar3 = (**(pAVar6->super_AStateProvider).super_AInventory.super_AActor.
                               super_DThinker.super_DObject._vptr_DObject)(pAVar6);
                    pPVar7 = (PClass *)CONCAT44(extraout_var_00,iVar3);
                    (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                    super_DObject.Class = pPVar7;
                  }
                  bVar11 = pPVar7 != (PClass *)0x0;
                  if (pPVar7 != pPVar2 && bVar11) {
                    do {
                      pPVar7 = pPVar7->ParentClass;
                      bVar11 = pPVar7 != (PClass *)0x0;
                      if (pPVar7 == pPVar2) break;
                    } while (pPVar7 != (PClass *)0x0);
                  }
                  if (bVar11) {
                    if (!checkammo) {
                      return pAVar6;
                    }
                    bVar11 = AWeapon::CheckAmmo(pAVar6,2,false,false,-1);
                    if (bVar11) {
                      return pAVar6;
                    }
                  }
                }
              } while (uVar9 != 0);
            } while( true );
          }
          pAVar6 = player->ReadyWeapon;
          if ((((pAVar6->super_AStateProvider).super_AInventory.field_0x4fd & 4) != 0) &&
             (pAVar1 = (pAVar6->SisterWeapon).field_0.p, pAVar1 != (AWeapon *)0x0)) {
            if (((pAVar1->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                 super_DObject.ObjectFlags & 0x20) == 0) {
              pPVar5 = (PClassWeapon *)
                       (pAVar1->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                       super_DObject.Class;
              if (pPVar5 == (PClassWeapon *)0x0) {
                pPVar5 = (PClassWeapon *)
                         (*(code *)*(pAVar1->super_AStateProvider).super_AInventory.super_AActor.
                                    super_DThinker.super_DObject._vptr_DObject)(pAVar1);
                (pAVar1->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                super_DObject.Class = (PClass *)pPVar5;
              }
              if (pPVar5 == (this->Weapons).Array[uVar8].Type) goto LAB_004ad213;
            }
            else {
              (pAVar6->SisterWeapon).field_0.p = (AWeapon *)0x0;
            }
          }
LAB_004ad228:
          uVar8 = uVar8 + 1;
          uVar9 = (this->Weapons).Count;
        } while (uVar8 < uVar9);
      }
      if (-1 < (int)(uVar9 - 1)) {
        uVar8 = (ulong)(uVar9 - 1);
        do {
          pAVar6 = (AWeapon *)
                   AActor::FindInventory
                             (&player->mo->super_AActor,
                              (PClassActor *)(this->Weapons).Array[uVar8].Type,false);
          pPVar2 = AWeapon::RegistrationInfo.MyClass;
          if (pAVar6 != (AWeapon *)0x0) {
            pPVar7 = (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                     super_DObject.Class;
            if (pPVar7 == (PClass *)0x0) {
              iVar3 = (**(pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker
                         .super_DObject._vptr_DObject)(pAVar6);
              pPVar7 = (PClass *)CONCAT44(extraout_var_01,iVar3);
              (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
              super_DObject.Class = pPVar7;
            }
            bVar11 = pPVar7 != (PClass *)0x0;
            if (pPVar7 != pPVar2 && bVar11) {
              do {
                pPVar7 = pPVar7->ParentClass;
                bVar11 = pPVar7 != (PClass *)0x0;
                if (pPVar7 == pPVar2) break;
              } while (pPVar7 != (PClass *)0x0);
            }
            if (bVar11) {
              if (!checkammo) {
                return pAVar6;
              }
              bVar11 = AWeapon::CheckAmmo(pAVar6,2,false,false,-1);
              if (bVar11) {
                return pAVar6;
              }
            }
          }
          bVar11 = 0 < (long)uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar11);
      }
      pAVar6 = player->ReadyWeapon;
    }
  }
  return pAVar6;
}

Assistant:

AWeapon *FWeaponSlot::PickWeapon(player_t *player, bool checkammo)
{
	int i, j;

	if (player->mo == NULL)
	{
		return NULL;
	}
	// Does this slot even have any weapons?
	if (Weapons.Size() == 0)
	{
		return player->ReadyWeapon;
	}
	if (player->ReadyWeapon != NULL)
	{
		for (i = 0; (unsigned)i < Weapons.Size(); i++)
		{
			if (Weapons[i].Type == player->ReadyWeapon->GetClass() ||
				(player->ReadyWeapon->WeaponFlags & WIF_POWERED_UP &&
				 player->ReadyWeapon->SisterWeapon != NULL &&
				 player->ReadyWeapon->SisterWeapon->GetClass() == Weapons[i].Type))
			{
				for (j = (i == 0 ? Weapons.Size() - 1 : i - 1);
					j != i;
					j = (j == 0 ? Weapons.Size() - 1 : j - 1))
				{
					AWeapon *weap = static_cast<AWeapon *> (player->mo->FindInventory(Weapons[j].Type));

					if (weap != NULL && weap->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						if (!checkammo || weap->CheckAmmo(AWeapon::EitherFire, false))
						{
							return weap;
						}
					}
				}
			}
		}
	}
	for (i = Weapons.Size() - 1; i >= 0; i--)
	{
		AWeapon *weap = static_cast<AWeapon *> (player->mo->FindInventory(Weapons[i].Type));

		if (weap != NULL && weap->IsKindOf(RUNTIME_CLASS(AWeapon)))
		{
			if (!checkammo || weap->CheckAmmo(AWeapon::EitherFire, false))
			{
				return weap;
			}
		}
	}
	return player->ReadyWeapon;
}